

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O3

void __thiscall KrazyMeans::selectRandomCentroids(KrazyMeans *this)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  element_type *peVar2;
  element_type *peVar3;
  size_t __i;
  long lVar4;
  ulong uVar5;
  FeatureVec *vector;
  vector<float,_std::allocator<float>_> *this_00;
  UniformRandomGenerator<long> rg;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13c8;
  uniform_int_distribution<long> local_40;
  
  local_13c8._M_x[0] = 0;
  lVar4 = 1;
  uVar5 = 0;
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4);
    local_13c8._M_x[lVar4] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_13c8._M_p = 0x270;
  local_40._M_param._M_a = 0;
  local_40._M_param._M_b = 0x7fffffffffffffff;
  this_00 = &((this->centroids).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
              super__Vector_impl_data._M_start)->values;
  pvVar1 = &((this->centroids).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
             super__Vector_impl_data._M_finish)->values;
  if (this_00 != pvVar1) {
    do {
      peVar2 = (this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar5 = std::uniform_int_distribution<long>::operator()
                        (&local_40,&local_13c8,&local_40._M_param);
      peVar3 = (this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::vector<float,_std::allocator<float>_>::operator=
                (this_00,(vector<float,_std::allocator<float>_> *)
                         ((uVar5 % (ulong)(((long)*(pointer *)
                                                   ((long)&(peVar3->vectors).
                                                                                                                      
                                                  super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                            (long)(peVar3->vectors).
                                                  super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                          -0x5555555555555555)) * 0x18 +
                         (long)(peVar2->vectors).
                               super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
                               super__Vector_impl_data._M_start));
      this_00 = this_00 + 1;
    } while (this_00 != pvVar1);
  }
  return;
}

Assistant:

void KrazyMeans::selectRandomCentroids() {
  UniformRandomGenerator<long> rg;
  // For each cluster centroid, randomly select a feature vector as initialization.
  for (auto &vector : centroids) {
    vector = data_set->vectors[rg.next() % data_set->size()];
  }
}